

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charls_jpegls_encoder.cpp
# Opt level: O2

void __thiscall
charls_jpegls_encoder::write_spiff_entry
          (charls_jpegls_encoder *this,uint32_t entry_tag,void *entry_data,
          size_t entry_data_size_bytes)

{
  jpegls_errc error_value;
  
  if ((entry_data_size_bytes == 0 || entry_data != (void *)0x0) && (entry_tag != 1)) {
    if (entry_data_size_bytes < 0xfff9) {
      charls::check_operation(this->state_ == spiff_header);
      charls::jpeg_stream_writer::write_spiff_directory_entry
                (&this->writer_,entry_tag,entry_data,entry_data_size_bytes);
      return;
    }
    error_value = invalid_argument_size;
  }
  else {
    error_value = InvalidJlsParameters;
  }
  charls::impl::throw_jpegls_error(error_value);
}

Assistant:

void write_spiff_entry(const uint32_t entry_tag, CHARLS_IN_READS_BYTES(entry_data_size_bytes) const void* entry_data,
                           const size_t entry_data_size_bytes)
    {
        check_argument(entry_data || entry_data_size_bytes == 0);
        check_argument(entry_tag != spiff_end_of_directory_entry_type);
        check_argument(entry_data_size_bytes <= 65528, jpegls_errc::invalid_argument_size);
        check_operation(state_ == state::spiff_header);

        writer_.write_spiff_directory_entry(entry_tag, entry_data, entry_data_size_bytes);
    }